

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall CVmObjFrameRef::save_to_file(CVmObjFrameRef *this,CVmFile *fp)

{
  long *plVar1;
  int iVar2;
  vm_val_t *val;
  char buf [5];
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  if (*plVar1 != 0) {
    make_snapshot(this);
  }
  CVmFile::write_uint2(fp,*(uint *)(plVar1 + 4));
  CVmFile::write_uint2(fp,*(uint *)((long)plVar1 + 0x24));
  vmb_put_dh(buf,(vm_val_t *)(plVar1 + 1));
  CVmFile::write_bytes(fp,buf,5);
  vmb_put_dh(buf,(vm_val_t *)(plVar1 + 5));
  CVmFile::write_bytes(fp,buf,5);
  CVmFile::write_uint4(fp,*(uint *)(plVar1 + 7));
  CVmFile::write_uint4(fp,*(uint *)((long)plVar1 + 0x3c));
  CVmFile::write_uint2(fp,(uint)*(ushort *)(plVar1 + 8));
  vmb_put_dh(buf,(vm_val_t *)(plVar1 + 9));
  CVmFile::write_bytes(fp,buf,5);
  val = (vm_val_t *)(plVar1 + 0xb);
  for (iVar2 = (int)plVar1[4] + *(int *)((long)plVar1 + 0x24); 0 < iVar2; iVar2 = iVar2 + -1) {
    vmb_put_dh(buf,val);
    CVmFile::write_bytes(fp,buf,5);
    val = val + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    
    /* get our extension */
    vm_frameref_ext *ext = get_ext();
    
    /* 
     *   If our frame is still active, make a snapshot of the variables.  The
     *   stack frame itself is inherently transient, so we can only save the
     *   snapshot version.  
     */
    if (ext->fp != 0)
        make_snapshot(vmg0_);

    /* save the variable counts */
    fp->write_uint2(ext->nlocals);
    fp->write_uint2(ext->nparams);

    /* save the entry pointer */
    vmb_put_dh(buf, &ext->entry);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the method context values */
    vmb_put_dh(buf, &ext->self);
    fp->write_bytes(buf, VMB_DATAHOLDER);
    fp->write_uint4(ext->defobj);
    fp->write_uint4(ext->targobj);
    fp->write_uint2(ext->targprop);
    vmb_put_dh(buf, &ext->invokee);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the variable snapshot values */
    int i;
    const vm_val_t *v;
    for (i = ext->nparams + ext->nlocals, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_put_dh(buf, v);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }
}